

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O1

int Saig_ManRetimeCountCut(Aig_Man_t *p,Vec_Ptr_t *vCut)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint *__ptr;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  Aig_ManIncrementTravId(p);
  if (0 < vCut->nSize) {
    lVar10 = 0;
    do {
      Saig_ManMarkCone_rec(p,(Aig_Obj_t *)vCut->pArray[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < vCut->nSize);
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar4 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar4;
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar10 = 0;
    do {
      pvVar4 = pVVar5->pArray[lVar10];
      if ((pvVar4 != (void *)0x0) && (*(int *)((long)pvVar4 + 0x20) != p->nTravIds)) {
        uVar9 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
        if ((uVar9 != 0) &&
           (((*(byte *)(uVar9 + 0x18) & 0x10) == 0 && (*(int *)(uVar9 + 0x20) == p->nTravIds)))) {
          uVar2 = __ptr[1];
          uVar3 = *__ptr;
          if (uVar2 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar6 = malloc(0x80);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar8 = 0x10;
            }
            else {
              uVar8 = uVar3 * 2;
              if ((int)uVar8 <= (int)uVar3) goto LAB_006ee226;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar6 = malloc((ulong)uVar3 << 4);
              }
              else {
                pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar6;
            *__ptr = uVar8;
          }
LAB_006ee226:
          __ptr[1] = uVar2 + 1;
          *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = uVar9;
          *(byte *)(uVar9 + 0x18) = *(byte *)(uVar9 + 0x18) | 0x10;
        }
        uVar9 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
        if (((uVar9 != 0) && ((*(byte *)(uVar9 + 0x18) & 0x10) == 0)) &&
           (*(int *)(uVar9 + 0x20) == p->nTravIds)) {
          uVar2 = __ptr[1];
          uVar3 = *__ptr;
          if (uVar2 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x80);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
              }
              uVar8 = 0x10;
            }
            else {
              uVar8 = uVar3 * 2;
              if ((int)uVar8 <= (int)uVar3) goto LAB_006ee2b8;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc((ulong)uVar3 << 4);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
              }
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = uVar8;
          }
LAB_006ee2b8:
          __ptr[1] = uVar2 + 1;
          *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar2 * 8) = uVar9;
          *(byte *)(uVar9 + 0x18) = *(byte *)(uVar9 + 0x18) | 0x10;
        }
      }
      lVar10 = lVar10 + 1;
      pVVar5 = p->vObjs;
    } while (lVar10 < pVVar5->nSize);
  }
  uVar2 = __ptr[1];
  if (0 < (long)(int)uVar2) {
    lVar10 = *(long *)(__ptr + 2);
    lVar7 = 0;
    do {
      puVar1 = (ulong *)(*(long *)(lVar10 + lVar7 * 8) + 0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffef;
      lVar7 = lVar7 + 1;
    } while ((int)uVar2 != lVar7);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return uVar2;
}

Assistant:

int Saig_ManRetimeCountCut( Aig_Man_t * p, Vec_Ptr_t * vCut )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pFanin;
    int i, RetValue;
    // mark the cones
    Aig_ManIncrementTravId( p );
    Vec_PtrForEachEntry( Aig_Obj_t *, vCut, pObj, i )
        Saig_ManMarkCone_rec( p, pObj );
    // collect the new cut
    vNodes = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        pFanin = Aig_ObjFanin0( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
        pFanin = Aig_ObjFanin1( pObj );
        if ( pFanin && !pFanin->fMarkA && Aig_ObjIsTravIdCurrent(p, pFanin) )
        {
            Vec_PtrPush( vNodes, pFanin );
            pFanin->fMarkA = 1;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->fMarkA = 0;
    RetValue = Vec_PtrSize( vNodes );
    Vec_PtrFree( vNodes );
    return RetValue;
}